

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDataDependenceAnalysis.cpp
# Opt level: O1

vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> * __thiscall
dg::dda::LLVMDataDependenceAnalysis::getLLVMDefinitions
          (vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *__return_storage_ptr__,
          LLVMDataDependenceAnalysis *this,Value *use)

{
  pointer *pppVVar1;
  iterator __position;
  int iVar2;
  RWNode *pRVar3;
  undefined4 extraout_var;
  raw_ostream *prVar4;
  size_t sVar5;
  char *pcVar6;
  undefined8 *puVar7;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> rdDefs;
  Value *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  long local_30;
  
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar3 = GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::getNode
                     (*(GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph> **)
                       (this + 0xb0),use);
  if (pRVar3 == (RWNode *)0x0) {
    prVar4 = (raw_ostream *)llvm::errs();
    pcVar6 = "[DDA] error: no node for: ";
    sVar5 = 0x1a;
  }
  else {
    iVar2 = (*pRVar3->_vptr_RWNode[2])(pRVar3);
    if (*(long *)(CONCAT44(extraout_var,iVar2) + 0x88) != 0) {
      if ((use[0x10] != (Value)0x3b) && (use[0x10] != (Value)0x53)) {
        prVar4 = (raw_ostream *)llvm::errs();
        Str.Length = 0x2d;
        Str.Data = "[DDA] error: the queried value is not a use: ";
        prVar4 = llvm::raw_ostream::operator<<(prVar4,Str);
        llvm::Value::print((raw_ostream *)use,SUB81(prVar4,0));
        Str_00.Length = 1;
        Str_00.Data = "\n";
        llvm::raw_ostream::operator<<(prVar4,Str_00);
      }
      (**(code **)(*(long *)**(undefined8 **)(this + 0xb8) + 0x20))
                (&local_40,(long *)**(undefined8 **)(this + 0xb8),pRVar3);
      for (puVar7 = local_40; puVar7 != local_38; puVar7 = puVar7 + 1) {
        local_48 = GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::getValue
                             (*(GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>
                                **)(this + 0xb0),(RWNode *)*puVar7);
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<llvm::Value*,std::allocator<llvm::Value*>>::_M_realloc_insert<llvm::Value*>
                    ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)__return_storage_ptr__,
                     __position,&local_48);
        }
        else {
          *__position._M_current = local_48;
          pppVVar1 = &(__return_storage_ptr__->
                      super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppVVar1 = *pppVVar1 + 1;
        }
      }
      if (local_40 == (undefined8 *)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete(local_40,local_30 - (long)local_40);
      return __return_storage_ptr__;
    }
    prVar4 = (raw_ostream *)llvm::errs();
    pcVar6 = "[DDA] error: the queried value has empty uses: ";
    sVar5 = 0x2f;
  }
  Str_01.Length = sVar5;
  Str_01.Data = pcVar6;
  prVar4 = llvm::raw_ostream::operator<<(prVar4,Str_01);
  llvm::Value::print((raw_ostream *)use,SUB81(prVar4,0));
  Str_02.Length = 1;
  Str_02.Data = "\n";
  llvm::raw_ostream::operator<<(prVar4,Str_02);
  return __return_storage_ptr__;
}

Assistant:

std::vector<llvm::Value *>
LLVMDataDependenceAnalysis::getLLVMDefinitions(llvm::Value *use) {
    std::vector<llvm::Value *> defs;

    auto *loc = getNode(use);
    if (!loc) {
        llvm::errs() << "[DDA] error: no node for: " << *use << "\n";
        return defs;
    }

    if (loc->getUses().empty()) {
        llvm::errs() << "[DDA] error: the queried value has empty uses: "
                     << *use << "\n";
        return defs;
    }

    if (!llvm::isa<llvm::LoadInst>(use) && !llvm::isa<llvm::CallInst>(use)) {
        llvm::errs() << "[DDA] error: the queried value is not a use: " << *use
                     << "\n";
    }

    auto rdDefs = getDefinitions(loc);
#ifndef NDEBUG
    if (rdDefs.empty()) {
        if (!loc->usesOnlyGlobals()) {
            static std::set<const llvm::Value *> reported;
            if (reported.insert(use).second) {
                llvm::errs()
                        << "[DDA] warn: no definitions for: " << *use << "\n";
            }
        }
    }
#endif // NDEBUG

    // map the values
    for (RWNode *nd : rdDefs) {
        assert(nd->getType() != RWNodeType::PHI);
        const auto *llvmvalue = getValue(nd);
        assert(llvmvalue && "Have no value for a node");
        defs.push_back(const_cast<llvm::Value *>(llvmvalue));
    }

    return defs;
}